

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# romfs.cpp
# Opt level: O3

DIR * __thiscall pstore::romfs::romfs::opendir(romfs *this,char *__name)

{
  directory *pdVar1;
  error_code *peVar2;
  not_null<const_pstore::romfs::dirent_*> *pnVar3;
  directory **ppdVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  dirent_descriptor *pdVar5;
  not_null<const_char_*> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  error_code eVar6;
  error_or<const_pstore::romfs::directory_*> local_70;
  error_or<pstore::gsl::not_null<const_pstore::romfs::dirent_*>_> local_58;
  error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> local_40;
  
  parse_path(&local_58,(romfs *)__name,in_RDX,*(directory **)(__name + 8));
  if (local_58.has_error_ == false) {
    pnVar3 = error_or<pstore::gsl::not_null<pstore::romfs::dirent_const*>>::
             value_storage_impl<pstore::error_or<pstore::gsl::not_null<pstore::romfs::dirent_const*>>&,pstore::gsl::not_null<pstore::romfs::dirent_const*>>
                       (&local_58);
    if ((pnVar3->ptr_->stat_).mode == directory) {
      dirent::opendir((dirent *)&local_40,(char *)pnVar3->ptr_);
      local_70.has_error_ = true;
      error_or<pstore::romfs::directory_const*>::
      move_construct<pstore::gsl::not_null<pstore::romfs::directory_const*>>
                ((error_or<pstore::romfs::directory_const*> *)&local_70,&local_40);
      if (local_40.has_error_ == false) {
        error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>::
        value_storage_impl<pstore::error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>&,pstore::gsl::not_null<pstore::romfs::directory_const*>>
                  (&local_40);
      }
      else {
        error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>::
        error_storage_impl<pstore::error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>&,std::error_code>
                  (&local_40);
      }
    }
    else {
      get_romfs_error_category();
      local_70.has_error_ = true;
      peVar2 = error_or<pstore::romfs::directory_const*>::
               error_storage_impl<pstore::error_or<pstore::romfs::directory_const*>&,std::error_code>
                         (&local_70);
      peVar2->_M_value = 0x14;
      peVar2->_M_cat = &get_romfs_error_category::cat.super_error_category;
    }
  }
  else {
    eVar6 = error_or<pstore::gsl::not_null<const_pstore::romfs::dirent_*>_>::get_error(&local_58);
    local_70.has_error_ = true;
    peVar2 = error_or<pstore::romfs::directory_const*>::
             error_storage_impl<pstore::error_or<pstore::romfs::directory_const*>&,std::error_code>
                       (&local_70);
    peVar2->_M_value = eVar6._M_value;
    peVar2->_M_cat = eVar6._M_cat;
  }
  if (local_70.has_error_ == false) {
    ppdVar4 = error_or<pstore::romfs::directory_const*>::
              value_storage_impl<pstore::error_or<pstore::romfs::directory_const*>&,pstore::romfs::directory_const*>
                        (&local_70);
    pdVar1 = *ppdVar4;
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
    this_00->_M_use_count = 1;
    this_00->_M_weak_count = 1;
    this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00137990;
    this_00[1]._vptr__Sp_counted_base = (_func_int **)pdVar1;
    this_00[1]._M_use_count = 0;
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = 2;
    }
    *(undefined1 *)&this[1].root_.ptr_ = 0;
    pdVar5 = error_or<pstore::romfs::dirent_descriptor>::
             value_storage_impl<pstore::error_or<pstore::romfs::dirent_descriptor>&,pstore::romfs::dirent_descriptor>
                       ((error_or<pstore::romfs::dirent_descriptor> *)this);
    (pdVar5->f_).super___shared_ptr<pstore::romfs::open_directory,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)(this_00 + 1);
    (pdVar5->f_).super___shared_ptr<pstore::romfs::open_directory,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = this_00;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  else {
    eVar6 = error_or<const_pstore::romfs::directory_*>::get_error(&local_70);
    *(undefined1 *)&this[1].root_.ptr_ = 1;
    peVar2 = error_or<pstore::romfs::dirent_descriptor>::
             error_storage_impl<pstore::error_or<pstore::romfs::dirent_descriptor>&,std::error_code>
                       ((error_or<pstore::romfs::dirent_descriptor> *)this);
    peVar2->_M_value = eVar6._M_value;
    peVar2->_M_cat = eVar6._M_cat;
  }
  if (local_70.has_error_ == false) {
    error_or<pstore::romfs::directory_const*>::
    value_storage_impl<pstore::error_or<pstore::romfs::directory_const*>&,pstore::romfs::directory_const*>
              (&local_70);
  }
  else {
    error_or<pstore::romfs::directory_const*>::
    error_storage_impl<pstore::error_or<pstore::romfs::directory_const*>&,std::error_code>
              (&local_70);
  }
  if (local_58.has_error_ == false) {
    error_or<pstore::gsl::not_null<pstore::romfs::dirent_const*>>::
    value_storage_impl<pstore::error_or<pstore::gsl::not_null<pstore::romfs::dirent_const*>>&,pstore::gsl::not_null<pstore::romfs::dirent_const*>>
              (&local_58);
  }
  else {
    error_or<pstore::gsl::not_null<pstore::romfs::dirent_const*>>::
    error_storage_impl<pstore::error_or<pstore::gsl::not_null<pstore::romfs::dirent_const*>>&,std::error_code>
              (&local_58);
  }
  return (DIR *)this;
}

Assistant:

error_or<dirent_descriptor> romfs::opendir (not_null<czstring> const path) {
            auto get_directory = [] (dirent const * const de) {
                using rett = error_or<directory const *>;
                return de->is_directory () ? rett{de->opendir ()}
                                           : rett{make_error_code (error_code::enotdir)};
            };

            auto create_descriptor = [] (directory const * const d) {
                auto const directory = std::make_shared<open_directory> (*d);
                return error_or<dirent_descriptor>{dirent_descriptor{directory}};
            };

            return (this->parse_path (path) >>= get_directory) >>= create_descriptor;
        }